

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_base.cpp
# Opt level: O2

void __thiscall
Base_z2_column_with_row_access_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>
::test_method(Base_z2_column_with_row_access_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>
              *this)

{
  Column_settings settings;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  matrix;
  Row_container rows;
  Column_settings local_61;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  local_60;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  local_48;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  local_28;
  
  local_48.
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  build_column_matrix<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>>>>
            (&local_60,&local_48,&local_61);
  column_test_common_z2_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>
            (&local_60);
  std::
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  ::clear(&local_60);
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  ::clear(&local_48);
  build_column_matrix<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>>>>>
            (&local_28,&local_48,&local_61);
  std::
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  ::_M_move_assign(&local_60,&local_28);
  std::
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  ::~vector(&local_28);
  column_test_base_z2_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>
            (&local_60);
  std::
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Base_z5_column_content_access, Column, z5_no_row_access_columns) {
  typename Column::Column_settings settings(5);
  std::vector<Column> matrix = build_column_matrix<Column>(settings);
  column_test_common_z5_content_access(matrix);
}